

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,double *x,double *buffer_sd,
                 bool as_relative_gain,double *buffer_imputed_x,double *saved_xmedian,
                 size_t *split_ix,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  uint uVar1;
  unsigned_long *__first;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  unsigned_long *__last;
  undefined7 in_register_00000089;
  size_t st_non_na;
  size_t st_00;
  double dVar5;
  undefined8 in_XMM0_Qb;
  double dVar6;
  allocator_type local_8d;
  undefined4 local_8c;
  double local_88;
  undefined8 uStack_80;
  vector<double,_std::allocator<double>_> temp_buffer;
  double *x_local;
  size_t local_38;
  
  local_88 = 0.0;
  uStack_80 = 0;
  if (1 < criterion - FullGain) {
    local_88 = min_gain;
    uStack_80 = in_XMM0_Qb;
  }
  uVar3 = st;
  st_00 = st;
  if (st <= end && missing_action != Fail) {
    do {
      if (0x7fefffffffffffff < (ulong)ABS(x[ix_arr[uVar3]])) {
        sVar4 = ix_arr[st_00];
        ix_arr[st_00] = ix_arr[uVar3];
        ix_arr[uVar3] = sVar4;
        st_00 = st_00 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= end);
  }
  if (end <= st_00) {
    return -INFINITY;
  }
  __first = ix_arr + st_00;
  x_local = x;
  if (st_00 == end - 1) {
    dVar5 = x[*__first];
    dVar6 = x[ix_arr[end]];
    if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
      return -INFINITY;
    }
    dVar5 = midpoint_with_reorder<double>(dVar5,dVar6);
    *split_point = dVar5;
    *split_ix = st_00;
    return (double)(-(ulong)(local_88 < 1.0) & 0x3ff0000000000000);
  }
  local_8c = (undefined4)CONCAT71(in_register_00000089,as_relative_gain);
  __last = ix_arr + end + 1;
  local_38 = st;
  if (__first != __last) {
    uVar3 = (long)__last - (long)__first >> 3;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,double*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3329:46)>
                )&x_local);
    std::
    __final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,double*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3329:46)>
                )&x_local);
  }
  sVar4 = local_38;
  dVar5 = x_local[*__first];
  dVar6 = x_local[ix_arr[end]];
  if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
    return -INFINITY;
  }
  *xmin = dVar5;
  *xmax = dVar6;
  uVar1 = criterion - Averaged;
  dVar5 = 0.0;
  if (uVar1 < 2) {
    dVar6 = 0.0;
    uVar3 = st_00;
    do {
      dVar5 = dVar5 + x_local[ix_arr[uVar3]];
      dVar6 = dVar6 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[ix_arr[uVar3]];
      uVar3 = uVar3 + 1;
    } while (uVar3 <= end);
    dVar5 = dVar5 / dVar6;
  }
  if (local_38 < st_00 && missing_action == Impute) {
    fill_NAs_with_median<double>(ix_arr,local_38,st_00,end,x_local,buffer_imputed_x,saved_xmedian);
    if (((criterion != Pooled) || (0.0 < local_88)) || ((char)local_8c == '\0')) {
      if (1 < uVar1) {
        if (criterion != DensityCrit) {
          dVar5 = 0.0;
          if (criterion == FullGain) {
            std::vector<double,_std::allocator<double>_>::vector(&temp_buffer,ncols * 2,&local_8d);
            local_88 = find_split_full_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (buffer_imputed_x,sVar4,end,ix_arr,cols_use,ncols_use,
                                  force_cols_use,X_row_major,ncols,Xr,Xr_ind,Xr_indptr,
                                  temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + ncols,split_ix,
                                  split_point,true,w);
            eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>();
            dVar5 = local_88;
          }
          goto LAB_00173a37;
        }
LAB_00173aac:
        dVar5 = find_split_dens_weighted<double,std::vector<double,std::allocator<double>>,double>
                          (buffer_imputed_x,ix_arr,sVar4,end,split_point,split_ix,w);
        goto LAB_00173a37;
      }
LAB_00173a1c:
      dVar5 = find_split_std_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                        (buffer_imputed_x,dVar5,ix_arr,sVar4,end,buffer_sd,criterion,local_88,
                         split_point,split_ix,w);
      goto LAB_00173a37;
    }
  }
  else {
    sVar4 = st_00;
    buffer_imputed_x = x_local;
    if (((criterion != Pooled) || (0.0 < local_88)) || ((char)local_8c == '\0')) {
      if (1 < uVar1) {
        if (criterion != DensityCrit) {
          dVar5 = 0.0;
          if (criterion == FullGain) {
            std::vector<double,_std::allocator<double>_>::vector(&temp_buffer,ncols * 2,&local_8d);
            local_88 = find_split_full_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (x_local,st_00,end,ix_arr,cols_use,ncols_use,force_cols_use,
                                  X_row_major,ncols,Xr,Xr_ind,Xr_indptr,
                                  temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + ncols,split_ix,
                                  split_point,true,w);
            eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>();
            dVar5 = local_88;
          }
          goto LAB_00173a37;
        }
        goto LAB_00173aac;
      }
      goto LAB_00173a1c;
    }
  }
  dVar5 = find_split_rel_gain_weighted_t<double,double,std::vector<double,std::allocator<double>>>
                    (buffer_imputed_x,dVar5,ix_arr,sVar4,end,split_point,split_ix,w);
LAB_00173a37:
  if (dVar5 <= 0.0) {
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double eval_guided_crit_weighted(size_t *restrict ix_arr, size_t st, size_t end, real_t_ *restrict x,
                                 double *restrict buffer_sd, bool as_relative_gain,
                                 double *restrict buffer_imputed_x, double *restrict saved_xmedian,
                                 size_t &split_ix, double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t st_orig = st;
    double gain = 0;
    if (criterion == DensityCrit || criterion == FullGain) min_gain = 0;

    /* move NAs to the front if there's any, exclude them from calculations */
    if (missing_action != Fail)
        st = move_NAs_to_front(ix_arr, st, end, x);

    if (unlikely(st >= end)) return -HUGE_VAL;
    else if (unlikely(st == (end-1)))
    {
        if (x[ix_arr[st]] == x[ix_arr[end]])
            return -HUGE_VAL;
        split_point = midpoint_with_reorder(x[ix_arr[st]], x[ix_arr[end]]);
        split_ix    = st;
        gain        = 1.;
        if (gain > min_gain)
            return gain;
        else
            return 0.;
    }

    /* sort in ascending order */
    std::sort(ix_arr + st, ix_arr + end + 1, [&x](const size_t a, const size_t b){return x[a] < x[b];});
    if (x[ix_arr[st]] == x[ix_arr[end]]) return -HUGE_VAL;
    xmin = x[ix_arr[st]]; xmax = x[ix_arr[end]];

    /* unlike the previous case for the extended model, the data here has not been centered,
       which could make the standard deviations have poor precision. It's nevertheless not
       necessary for this mean to have good precision, since it's only meant for centering,
       so it can be calculated inexactly with simd instructions. */
    real_t_ xmean = 0;
    real_t_ cnt = 0;
    if (criterion == Pooled || criterion == Averaged)
    {
        for (size_t ix = st; ix <= end; ix++)
        {
            xmean += x[ix_arr[ix]];
            cnt += w[ix_arr[ix]];
        }
        xmean /= cnt;
    }

    if (missing_action == Impute && st > st_orig)
    {
        missing_action = Fail;
        fill_NAs_with_median(ix_arr, st_orig, st, end, x, buffer_imputed_x, saved_xmedian);
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, split_point, split_ix, w);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, buffer_sd, criterion, min_gain, split_point, split_ix, w);
        else if (criterion == DensityCrit)
            gain = find_split_dens_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, ix_arr, st_orig, end, split_point, split_ix, w);
        else if (criterion == FullGain)
        {
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain_weighted<double, mapping, ldouble_safe>(
                                                 buffer_imputed_x, st_orig, end, ix_arr,
                                                 cols_use, ncols_use, force_cols_use,
                                                 X_row_major, ncols,
                                                 Xr, Xr_ind, Xr_indptr,
                                                 temp_buffer.data(), temp_buffer.data() + ncols,
                                                 split_ix, split_point, true,
                                                 w);
        }
    }

    else
    {
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain_weighted<real_t_, mapping, ldouble_safe>(x, xmean, ix_arr, st, end, split_point, split_ix, w);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain_weighted<real_t_, mapping, ldouble_safe>(x, xmean, ix_arr, st, end, buffer_sd, criterion, min_gain, split_point, split_ix, w);
        else if (criterion == DensityCrit)
            gain = find_split_dens_weighted<real_t_, mapping, ldouble_safe>(x, ix_arr, st, end, split_point, split_ix, w);
        else if (criterion == FullGain)
        {
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain_weighted<real_t_, mapping, ldouble_safe>(
                                                 x, st, end, ix_arr,
                                                 cols_use, ncols_use, force_cols_use,
                                                 X_row_major, ncols,
                                                 Xr, Xr_ind, Xr_indptr,
                                                 temp_buffer.data(), temp_buffer.data() + ncols,
                                                 split_ix, split_point, true,
                                                 w);
        }
    }

    /* Note: a gain of -Inf signals that the data is unsplittable. Zero signals it's below the minimum. */
    return std::fmax(0., gain);
}